

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O3

ImageList * __thiscall aeron::Subscription::addImage(Subscription *this,Image *image)

{
  Image *pIVar1;
  ImageList *pIVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  size_t *psVar7;
  __pointer_type pIVar8;
  size_t sVar9;
  size_t sVar10;
  Image *this_00;
  Image *image_00;
  long lVar11;
  Image *this_01;
  
  pIVar2 = (this->m_imageList)._M_b._M_p;
  sVar3 = pIVar2->m_length;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar3 + 1;
  uVar5 = SUB168(auVar4 * ZEXT816(0x128),0);
  uVar6 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar6 = 0xffffffffffffffff;
  }
  image_00 = pIVar2->m_images;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x128),8) == 0) {
    uVar5 = uVar6;
  }
  psVar7 = (size_t *)operator_new__(uVar5);
  pIVar1 = (Image *)(psVar7 + 1);
  sVar9 = sVar3 + 1;
  *psVar7 = sVar9;
  sVar10 = sVar3;
  this_01 = pIVar1;
  if (sVar9 != 0) {
    lVar11 = 0;
    this_00 = pIVar1;
    do {
      Image::Image(this_00);
      lVar11 = lVar11 + -0x128;
      this_00 = this_00 + 1;
    } while (sVar3 * -0x128 + -0x128 != lVar11);
    if (sVar3 == 0) goto LAB_00147774;
  }
  do {
    Image::operator=(this_01,image_00);
    image_00 = image_00 + 1;
    sVar10 = sVar10 - 1;
    this_01 = this_01 + 1;
  } while (sVar10 != 0);
LAB_00147774:
  Image::operator=(pIVar1 + sVar3,image);
  pIVar8 = (__pointer_type)operator_new(0x10);
  pIVar8->m_images = pIVar1;
  pIVar8->m_length = sVar9;
  (this->m_imageList)._M_b._M_p = pIVar8;
  return pIVar2;
}

Assistant:

struct ImageList *addImage(Image &image)
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image *oldArray = oldImageList->m_images;
        std::size_t length = oldImageList->m_length;
        auto newArray = new Image[length + 1];

        for (std::size_t i = 0; i < length; i++)
        {
            newArray[i] = oldArray[i];
        }

        newArray[length] = image; // copy-assign

        auto newImageList = new struct ImageList(newArray, length + 1);

        std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);

        return oldImageList;
    }